

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeEDSK.cpp
# Opt level: O1

int __thiscall
FormatTypeEDSK::SaveDisk
          (FormatTypeEDSK *this,char *file_path,IDisk *disk,ILoadingProgress *loading_progress)

{
  void *pvVar1;
  IDisk *this_00;
  uchar uVar2;
  unsigned_short uVar3;
  int iVar4;
  ulong *puVar5;
  long lVar6;
  byte bVar9;
  undefined8 *__ptr;
  ulong uVar7;
  uint uVar10;
  ulong uVar11;
  size_t __n;
  long lVar12;
  ulong uVar13;
  int side;
  ulong uVar14;
  uint uVar15;
  FILE *file;
  FILE *local_188;
  int local_17c;
  ulong *local_178;
  ulong local_170;
  IDisk *local_168;
  ulong *local_160;
  ulong *local_158;
  ulong local_150;
  undefined8 *local_148;
  long local_140;
  byte local_138 [32];
  undefined2 local_118;
  undefined8 local_116;
  undefined2 local_10e;
  undefined1 local_10c [4];
  undefined1 local_108;
  byte local_107;
  byte local_104 [212];
  byte bVar8;
  
  iVar4 = IDisk::SmartOpen(disk,(FILE **)&local_188,file_path,".DSK");
  if (iVar4 == 0) {
    local_138[0x10] = ' ';
    local_138[0x11] = 'F';
    local_138[0x12] = 'i';
    local_138[0x13] = 'l';
    local_138[0x14] = 'e';
    local_138[0x15] = '\r';
    local_138[0x16] = '\n';
    local_138[0x17] = 'D';
    local_138[0x18] = 'i';
    local_138[0x19] = 's';
    local_138[0x1a] = 'k';
    local_138[0x1b] = '-';
    local_138[0x1c] = 'I';
    local_138[0x1d] = 'n';
    local_138[0x1e] = 'f';
    local_138[0x1f] = 'o';
    local_138[0] = 'E';
    local_138[1] = 'X';
    local_138[2] = 'T';
    local_138[3] = 'E';
    local_138[4] = 'N';
    local_138[5] = 'D';
    local_138[6] = 'E';
    local_138[7] = 'D';
    local_138[8] = ' ';
    local_138[9] = 'C';
    local_138[10] = 'P';
    local_138[0xb] = 'C';
    local_138[0xc] = ' ';
    local_138[0xd] = 'D';
    local_138[0xe] = 'S';
    local_138[0xf] = 'K';
    local_118 = 0xa0d;
    memset(local_10c,0,0xd4);
    local_116 = 0x786f427261677553;
    local_10e = 0xa0d;
    uVar15 = disk->side_[0].nb_tracks;
    local_108 = (undefined1)uVar15;
    local_107 = disk->nb_sides_;
    uVar15 = uVar15 * local_107;
    lVar12 = (ulong)uVar15 * 0x20;
    puVar5 = (ulong *)operator_new__(lVar12 + 8);
    *puVar5 = (ulong)uVar15;
    local_178 = puVar5 + 1;
    if (uVar15 != 0) {
      lVar6 = 0;
      do {
        *(undefined8 *)((long)local_178 + lVar6) = 0;
        ((undefined8 *)((long)local_178 + lVar6))[1] = 0;
        *(undefined8 *)((long)puVar5 + lVar6 + 0x18) = 0;
        lVar6 = lVar6 + 0x20;
      } while (lVar12 != lVar6);
    }
    local_158 = puVar5;
    if (disk->side_[0].nb_tracks != 0) {
      uVar15 = 0;
      iVar4 = 0x34;
      do {
        uVar10 = (uint)disk->nb_sides_;
        if (disk->nb_sides_ != 0) {
          lVar12 = 0;
          do {
            side = (int)lVar12;
            uVar3 = IDisk::GetTrackInfo(disk,side,uVar15,
                                        (Track *)(local_178 + (ulong)(uVar10 * uVar15 + side) * 4));
            bVar8 = (byte)(uVar3 >> 8);
            bVar9 = bVar8;
            if (uVar3 != 0) {
              if ((int)puVar5[(ulong)(disk->nb_sides_ * uVar15 + side) * 4 + 4] == 0) {
                bVar9 = 0;
              }
              else {
                bVar9 = (byte)(uVar3 + 0x100 >> 8);
                if ((char)uVar3 == '\0') {
                  bVar9 = bVar8;
                }
              }
            }
            local_138[lVar12 + iVar4] = bVar9;
            uVar10 = (uint)disk->nb_sides_;
            lVar12 = lVar12 + 1;
          } while ((uint)lVar12 < uVar10);
          iVar4 = iVar4 + (uint)lVar12;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < disk->side_[0].nb_tracks);
    }
    fwrite(local_138,0x100,1,local_188);
    if (disk->side_[0].nb_tracks != 0) {
      uVar7 = 0;
      puVar5 = local_178;
      local_168 = disk;
      do {
        uVar15 = (uint)disk->nb_sides_;
        if (disk->nb_sides_ != 0) {
          uVar10 = 0;
          local_170 = uVar7;
          do {
            iVar4 = uVar15 * (int)uVar7;
            uVar14 = (ulong)(iVar4 + uVar10);
            uVar13 = puVar5[uVar14 * 4];
            uVar11 = puVar5[uVar14 * 4 + 1];
            if (uVar11 != uVar13) {
              local_160 = puVar5 + uVar14 * 4;
              bVar9 = local_138[iVar4 + uVar10 + 0x34];
              uVar14 = (ulong)bVar9 * 0x100;
              __ptr = (undefined8 *)operator_new__(uVar14);
              __n = 0;
              if (bVar9 != 0) {
                __n = uVar14 - 0xc;
              }
              local_150 = uVar14;
              memset((void *)((long)__ptr + 0xc),0,__n);
              *__ptr = 0x6e492d6b63617254;
              *(undefined4 *)(__ptr + 1) = 0xa0d6f66;
              *(char *)(__ptr + 2) = (char)uVar7;
              *(char *)((long)__ptr + 0x11) = (char)uVar10;
              *(undefined1 *)((long)__ptr + 0x14) = *(undefined1 *)(uVar13 + 0xb);
              *(char *)((long)__ptr + 0x15) = (char)((uint)((int)uVar11 - (int)uVar13) >> 2) * '9';
              *(undefined1 *)((long)__ptr + 0x16) = *(undefined1 *)((long)local_160 + 0x1c);
              *(undefined1 *)((long)__ptr + 0x17) = 0xe5;
              uVar7 = *local_160;
              if (local_160[1] != uVar7) {
                iVar4 = 0x100;
                uVar13 = 0;
                lVar12 = 0x18;
                puVar5 = local_160;
                local_148 = __ptr;
                do {
                  this_00 = local_168;
                  uVar11 = local_170;
                  lVar6 = uVar13 * 0x24;
                  *(undefined1 *)((long)__ptr + lVar12) = *(undefined1 *)(uVar7 + 8 + lVar6);
                  *(undefined1 *)((long)__ptr + lVar12 + 1) = *(undefined1 *)(uVar7 + 9 + lVar6);
                  *(undefined1 *)((long)__ptr + lVar12 + 2) = *(undefined1 *)(uVar7 + 10 + lVar6);
                  *(undefined1 *)((long)__ptr + lVar12 + 3) = *(undefined1 *)(uVar7 + 0xb + lVar6);
                  *(undefined1 *)((long)__ptr + lVar12 + 4) = *(undefined1 *)(uVar7 + 0xd + lVar6);
                  *(undefined1 *)((long)__ptr + lVar12 + 5) = *(undefined1 *)(uVar7 + 0xe + lVar6);
                  *(undefined1 *)((long)__ptr + lVar12 + 6) = *(undefined1 *)(uVar7 + 0x10 + lVar6);
                  *(undefined1 *)((long)__ptr + lVar12 + 7) = *(undefined1 *)(uVar7 + 0x11 + lVar6);
                  if (*(short *)(*puVar5 + 0x10 + lVar6) != 0) {
                    uVar15 = *(int *)(uVar7 + lVar6 + 0x14) + 0x40;
                    lVar6 = 0;
                    local_17c = iVar4;
                    local_140 = lVar12;
                    do {
                      uVar2 = IDisk::GetNextByte(this_00,uVar10,(uint)uVar11,uVar15);
                      *(uchar *)((long)__ptr + lVar6 + iVar4) = uVar2;
                      uVar15 = uVar15 + 0x10;
                      lVar6 = lVar6 + 1;
                    } while ((uint)lVar6 < (uint)*(ushort *)(*local_160 + 0x10 + uVar13 * 0x24));
                    iVar4 = local_17c + (uint)lVar6;
                    puVar5 = local_160;
                    lVar12 = local_140;
                    __ptr = local_148;
                  }
                  lVar12 = lVar12 + 8;
                  uVar13 = (ulong)((int)uVar13 + 1);
                  uVar7 = *puVar5;
                  uVar11 = ((long)(puVar5[1] - uVar7) >> 2) * -0x71c71c71c71c71c7;
                } while (uVar13 <= uVar11 && uVar11 - uVar13 != 0);
              }
              fwrite(__ptr,local_150,1,local_188);
              operator_delete__(__ptr);
              puVar5 = local_178;
              uVar7 = local_170;
            }
            uVar10 = uVar10 + 1;
            uVar15 = (uint)local_168->nb_sides_;
            disk = local_168;
          } while (uVar10 < uVar15);
        }
        uVar15 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar15;
      } while (uVar15 < disk->side_[0].nb_tracks);
    }
    fclose(local_188);
    puVar5 = local_158;
    uVar13 = *local_158 * 0x20;
    uVar7 = uVar13 + 8;
    uVar11 = *local_158;
    while (uVar11 != 0) {
      pvVar1 = *(void **)((long)puVar5 + (uVar13 - 0x18));
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,*(long *)((long)puVar5 + (uVar13 - 8)) - (long)pvVar1);
      }
      uVar13 = uVar13 - 0x20;
      uVar11 = uVar13;
    }
    operator_delete__(puVar5,uVar7);
    disk->disk_modified_ = false;
  }
  return 0;
}

Assistant:

int FormatTypeEDSK::SaveDisk(const char* file_path, IDisk* disk, ILoadingProgress* loading_progress) const
{
   FILE* file;
   int res = disk->SmartOpen(&file, file_path, ".DSK");

   if (res == 0)
   {
      // DISK INFORMATION BLOCK
      unsigned int nb_sectors = 0;
      unsigned char dib[0x100] = {0};
      memcpy(dib, "EXTENDED CPC DSK File\r\nDisk-Info\r\n", 34);
      memcpy(&dib[0x22], "SugarBox\r\n", 10);

      dib[0x30] = disk->side_[0].nb_tracks;
      dib[0x31] = disk->nb_sides_;
      //memcpy ( &dib[0x30], &m_Disk[0].NbTracks , 1 );
      //memcpy ( &dib[0x31], &m_NbSide , 1 );

      // Track size table
      // For each track :
      IDisk::Track* track = new IDisk::Track[disk->side_[0].nb_tracks * disk->nb_sides_];

      int offset = 0x34;
      for (unsigned int j = 0; j < disk->side_[0].nb_tracks; j++)
      {
         for (int i = 0; i < disk->nb_sides_; i++)
         {
            // Get size
            unsigned short size = disk->GetTrackInfo(i, j, &track[j * disk->nb_sides_ + i]);

            if (size != 0)
            {
               if (track[j * disk->nb_sides_ + i].full_size_ == 0)
               {
                  size = 0;
               }
               else if ((size & 0xFFFFFF00) < size)
               {
                  size += 0x100;
               }
            }
            dib[offset++] = (unsigned char)(size >> 8);
         }
      }
      fwrite(dib, 0x100, 1, file);

      // For each track :
      for (unsigned int j = 0; j < disk->side_[0].nb_tracks; j++)
      {
         for (int i = 0; i < disk->nb_sides_; i++)
         {
            IDisk::Track* info_track = &track[j * disk->nb_sides_ + i];

            if (info_track->list_sector_.size() > 0)
            {
               // Allocate proper size
               unsigned short size = (dib[0x34 + i + (j * disk->nb_sides_)] << 8);

               unsigned char* track_data = new unsigned char[size];
               memset(track_data, 0, size);
               // Generate track data
               memcpy(track_data, "Track-Info\r\n", 12);
               track_data[0x10] = j;
               track_data[0x11] = i;

               // SZ = First N...
               track_data[0x14] = info_track->list_sector_[0].n;
               track_data[0x15] = static_cast<unsigned char>(info_track->list_sector_.size());
               track_data[0x16] = info_track->gap3_size_;
               track_data[0x17] = 0xE5; // ?

               // Sector information list
               offset = 0x18;
               int offset_data = 0x100;
               //for (std::vector<tSector>::iterator it = info_track->listSector.begin(); it != info_track->listSector.end(); it++)
               for (unsigned int sector_index = 0; sector_index < info_track->list_sector_.size(); sector_index++)
               {
                  ++nb_sectors;
                  track_data[offset++] = info_track->list_sector_[sector_index].c; // it->C;
                  track_data[offset++] = info_track->list_sector_[sector_index].h; // it->H;
                  track_data[offset++] = info_track->list_sector_[sector_index].r; // it->R;
                  track_data[offset++] = info_track->list_sector_[sector_index].n; // it->N;
                  track_data[offset++] = info_track->list_sector_[sector_index].status1; // it->Status1;
                  track_data[offset++] = info_track->list_sector_[sector_index].status2; // ->Status2;
                  track_data[offset++] = info_track->list_sector_[sector_index].real_size & 0xFF;
                  // (it->RealSize & 0xFF);
                  track_data[offset++] = info_track->list_sector_[sector_index].real_size >> 8; // (it->RealSize >> 8);

                  // Data
                  int index = info_track->list_sector_[sector_index].dam_offset + 64;
                  // it->DAMOffset + 64; // Jump the A1A1A1F8/B 4 bytes of IDAM.

                  for (int cpt = 0; cpt < info_track->list_sector_[sector_index].real_size/*  it->RealSize*/; cpt++)
                  {
                     track_data[offset_data++] = disk->GetNextByte(i, j, index);
                     if (offset_data > size)
                     {
                        int dbg = 1;
                     }
                     index += 16;
                  }
               }
               // Write it to the disk
               fwrite(track_data, size, 1, file);

               // Free tracks
               delete[]track_data;
            }
         }
      }

      // Free ressources
      fclose(file);
      delete[]track;

      disk->disk_modified_ = false;
   }
   return 0;
}